

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O2

void initGlobalBuffer(void)

{
  gBuffer[0].in = buf[0][0] + 100;
  gBuffer[0].out0 = buf[0][1] + 100;
  gBuffer[0].out1 = buf[0][2] + 100;
  gBuffer[0].out2 = buf[0][3] + 100;
  gBuffer[1].in = buf[1][0] + 100;
  gBuffer[1].out0 = buf[1][1] + 100;
  gBuffer[1].out1 = buf[1][2] + 100;
  gBuffer[1].out2 = buf[1][3] + 100;
  gBuffer[2].in = buf[2][0] + 100;
  gBuffer[2].out0 = buf[2][1] + 100;
  gBuffer[2].out1 = buf[2][2] + 100;
  gBuffer[2].out2 = buf[2][3] + 100;
  gBuffer[3].in = buf[3][0] + 100;
  gBuffer[3].out0 = buf[3][1] + 100;
  gBuffer[3].out1 = buf[3][2] + 100;
  gBuffer[3].out2 = buf[3][3] + 100;
  gBuffer[4].in = buf[4][0] + 100;
  gBuffer[4].out0 = buf[4][1] + 100;
  gBuffer[4].out1 = buf[4][2] + 100;
  gBuffer[4].out2 = buf[4][3] + 100;
  return;
}

Assistant:

void initGlobalBuffer( void )
{
   gBuffer[0].in   = &buf[0][0][TA_BUF_PREFIX];
   gBuffer[0].out0 = &buf[0][1][TA_BUF_PREFIX];
   gBuffer[0].out1 = &buf[0][2][TA_BUF_PREFIX];
   gBuffer[0].out2 = &buf[0][3][TA_BUF_PREFIX];

   gBuffer[1].in   = &buf[1][0][TA_BUF_PREFIX];
   gBuffer[1].out0 = &buf[1][1][TA_BUF_PREFIX];
   gBuffer[1].out1 = &buf[1][2][TA_BUF_PREFIX];
   gBuffer[1].out2 = &buf[1][3][TA_BUF_PREFIX];

   gBuffer[2].in   = &buf[2][0][TA_BUF_PREFIX];
   gBuffer[2].out0 = &buf[2][1][TA_BUF_PREFIX];
   gBuffer[2].out1 = &buf[2][2][TA_BUF_PREFIX];
   gBuffer[2].out2 = &buf[2][3][TA_BUF_PREFIX];

   gBuffer[3].in   = &buf[3][0][TA_BUF_PREFIX];
   gBuffer[3].out0 = &buf[3][1][TA_BUF_PREFIX];
   gBuffer[3].out1 = &buf[3][2][TA_BUF_PREFIX];
   gBuffer[3].out2 = &buf[3][3][TA_BUF_PREFIX];

   gBuffer[4].in   = &buf[4][0][TA_BUF_PREFIX];
   gBuffer[4].out0 = &buf[4][1][TA_BUF_PREFIX];
   gBuffer[4].out1 = &buf[4][2][TA_BUF_PREFIX];
   gBuffer[4].out2 = &buf[4][3][TA_BUF_PREFIX];
}